

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::PickerPrivate::computeStringWidth(PickerPrivate *this)

{
  QString *pQVar1;
  int iVar2;
  QRect QVar3;
  QString local_58;
  QRect local_40;
  int local_30;
  int local_2c;
  int width;
  int i;
  QString *local_20;
  QFontMetrics *fm;
  PickerPrivate *pPStack_10;
  int rowCount;
  PickerPrivate *this_local;
  
  this->maxStringWidth = 0x19;
  pPStack_10 = this;
  fm._4_4_ = Picker::count(this->q);
  if (0 < fm._4_4_) {
    QWidget::fontMetrics((QWidget *)&width);
    local_20 = (QString *)&width;
    for (local_2c = 0; pQVar1 = local_20, local_2c < fm._4_4_; local_2c = local_2c + 1) {
      Picker::itemText(&local_58,this->q,local_2c);
      QVar3 = (QRect)QFontMetrics::boundingRect(pQVar1);
      local_40 = QVar3;
      iVar2 = QRect::width(&local_40);
      QString::~QString(&local_58);
      if (this->maxStringWidth < iVar2) {
        this->maxStringWidth = iVar2;
      }
      local_30 = iVar2;
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&width);
  }
  return;
}

Assistant:

void
PickerPrivate::computeStringWidth()
{
	maxStringWidth = 25;

	const int rowCount = q->count();

	if( rowCount > 0 )
	{
		const QFontMetrics & fm = q->fontMetrics();

		for( int i = 0; i < rowCount; ++i )
		{
			const int width = fm.boundingRect( q->itemText( i ) ).width();

			if( width > maxStringWidth )
				maxStringWidth = width;
		}
	}
}